

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  ulong uVar1;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_48,&this->Directory);
    cmAlphaNum::cmAlphaNum(&local_78,'/');
    GetFullName_abi_cxx11_(&local_98,this);
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_48,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    GetFullName_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }